

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_json_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  version vVar1;
  global_object *pgVar2;
  gc_heap *h_00;
  anon_class_16_1_570cf4e1_for_f local_90;
  anon_class_16_1_570cf4e1_for_f local_80 [2];
  gc_heap_ptr<mjs::object> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  undefined1 local_30 [8];
  gc_heap_ptr<mjs::object> json;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar1 = global_object::language_version(pgVar2);
  if (1 < (int)vVar1) {
    h_00 = gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
    json.super_gc_heap_ptr_untyped._8_8_ = h_00;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"JSON");
    string::string(&local_40,h_00,&local_50);
    pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
    (*(pgVar2->super_object)._vptr_object[0xb])(&local_60);
    gc_heap::make<mjs::object,mjs::string,mjs::gc_heap_ptr<mjs::object>>
              ((gc_heap *)local_30,(string *)h_00,(gc_heap_ptr<mjs::object> *)&local_40);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_60);
    string::~string(&local_40);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_80[0].global,global);
    put_native_function<mjs::make_json_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__0>
              (global,(object_ptr *)local_30,"parse",local_80,2);
    make_json_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::~__0((__0 *)local_80);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_90.global,global);
    put_native_function<mjs::make_json_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__1>
              (global,(object_ptr *)local_30,"stringify",&local_90,3);
    make_json_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_1::~__1((__1 *)&local_90);
    gc_heap_ptr<mjs::object>::gc_heap_ptr
              (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::object> *)local_30);
    gc_heap_ptr<mjs::object>::gc_heap_ptr(&__return_storage_ptr__->prototype,(nullptr_t)0x0);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_30);
    return __return_storage_ptr__;
  }
  __assert_fail("global->language_version() >= version::es5",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                ,0x2e9,
                "global_object_create_result mjs::make_json_object(const gc_heap_ptr<global_object> &)"
               );
}

Assistant:

global_object_create_result make_json_object(const gc_heap_ptr<global_object>& global) {
    assert(global->language_version() >= version::es5);
    auto& h = global.heap();
    auto json = h.make<object>(string{h,"JSON"}, global->object_prototype());

    put_native_function(global, json, "parse", [global](const value&, const std::vector<value>& args) {
        auto g = global; // Keep local copy in case the function gets GC'ed
        return json_parse(g, args);
    }, 2);
    
    put_native_function(global, json, "stringify", [global](const value&, const std::vector<value>& args) {
        auto g = global; // Keep local copy in case the function gets GC'ed
        return json_stringify(g, args);
    }, 3);

    return { json, nullptr };
}